

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_pagehandle.cc
# Opt level: O1

RC __thiscall PF_PageHandle::GetPageNum(PF_PageHandle *this,PageNum *_pageNum)

{
  if (this->pPageData != (char *)0x0) {
    *_pageNum = this->pageNum;
    return 0;
  }
  return 7;
}

Assistant:

RC PF_PageHandle::GetPageNum(PageNum &_pageNum) const
{

  // Page must refer to a pinned page
  if (pPageData == NULL)
    return (PF_PAGEUNPINNED);

  // Set page number
  _pageNum = this->pageNum;

  // Return ok
  return (0);
}